

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::_InternalSerialize
          (CodeGeneratorRequest *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  string *psVar5;
  char *pcVar6;
  size_t __n;
  void *__src;
  uint32_t *puVar7;
  uint8_t *puVar8;
  Version *value;
  FileDescriptorProto *value_00;
  UnknownFieldSet *unknown_fields;
  void *__dest;
  uint local_84;
  uint n_1;
  uint i_1;
  string *s;
  int local_70;
  int n;
  int i;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  CodeGeneratorRequest *this_local;
  ptrdiff_t size;
  EpsCopyOutputStream *local_28;
  
  local_70 = 0;
  iVar2 = _internal_file_to_generate_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; local_70 < iVar2; local_70 = local_70 + 1) {
    psVar5 = _internal_file_to_generate_abi_cxx11_(this,local_70);
    pcVar6 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar3,SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    __n = std::__cxx11::string::size();
    bVar1 = true;
    if ((long)__n < 0x80) {
      puVar8 = stream->end_;
      iVar3 = io::EpsCopyOutputStream::TagSize(8);
      bVar1 = (long)(puVar8 + (-(long)iVar3 - (long)stream_local) + 0xf) < (long)__n;
    }
    if (bVar1) {
      local_28 = (EpsCopyOutputStream *)
                 io::EpsCopyOutputStream::WriteStringOutline
                           (stream,1,psVar5,(uint8_t *)stream_local);
    }
    else {
      *(undefined1 *)&stream_local->end_ = 10;
      __dest = (void *)((long)&stream_local->end_ + 2);
      *(char *)((long)&stream_local->end_ + 1) = (char)__n;
      __src = (void *)std::__cxx11::string::data();
      memcpy(__dest,__src,__n);
      local_28 = (EpsCopyOutputStream *)((long)__dest + __n);
    }
    stream_local = local_28;
  }
  puVar7 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  uVar4 = *puVar7;
  if ((uVar4 & 1) != 0) {
    _internal_parameter_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    _internal_parameter_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar2,SERIALIZE,"google.protobuf.compiler.CodeGeneratorRequest.parameter");
    psVar5 = _internal_parameter_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,2,psVar5,(uint8_t *)stream_local);
  }
  if ((uVar4 & 2) != 0) {
    puVar8 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value = _Internal::compiler_version(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::
                   InternalWriteMessage<google::protobuf::compiler::Version>(3,value,puVar8,stream);
  }
  local_84 = 0;
  uVar4 = _internal_proto_file_size(this);
  for (; local_84 < uVar4; local_84 = local_84 + 1) {
    puVar8 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_00 = _internal_proto_file(this,local_84);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::
                   InternalWriteMessage<google::protobuf::FileDescriptorProto>
                             (0xf,value_00,puVar8,stream);
  }
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* CodeGeneratorRequest::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorRequest)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string file_to_generate = 1;
  for (int i = 0, n = this->_internal_file_to_generate_size(); i < n; i++) {
    const auto& s = this->_internal_file_to_generate(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    target = stream->WriteString(1, s, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string parameter = 2;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_parameter().data(), static_cast<int>(this->_internal_parameter().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_parameter(), target);
  }

  // optional .google.protobuf.compiler.Version compiler_version = 3;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::compiler_version(this), target, stream);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_proto_file_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(15, this->_internal_proto_file(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorRequest)
  return target;
}